

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poisson.c
# Opt level: O3

void compFG(double **U,double **V,double **F,double **G,char **FLAG,double delt,lattice *grid,
           fluidSim *simulation)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  double *pdVar6;
  double *pdVar7;
  undefined1 auVar8 [16];
  long lVar9;
  double **ppdVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  int j;
  long lVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double local_78;
  double dStack_70;
  
  uVar2 = grid->deli;
  lVar11 = (long)(int)uVar2;
  if (-1 < lVar11) {
    dVar15 = grid->delx * grid->delx;
    dVar18 = grid->dely * grid->dely;
    iVar3 = grid->delj;
    lVar9 = (ulong)uVar2 + 1;
    lVar13 = 0;
    do {
      if (0 < iVar3) {
        pcVar5 = FLAG[lVar13];
        lVar14 = 0;
        do {
          bVar1 = pcVar5[lVar14 + 1];
          ppdVar10 = F;
          if (bVar1 == 0xf) {
            pdVar6 = U[lVar13 + 1];
            dVar19 = pdVar6[lVar14 + 1];
            auVar20._0_8_ = U[lVar13][lVar14 + 1] + (U[lVar13 + 2][lVar14 + 1] - (dVar19 + dVar19));
            auVar20._8_8_ = pdVar6[lVar14] + (pdVar6[lVar14 + 2] - (dVar19 + dVar19));
            auVar21._8_8_ = dVar18;
            auVar21._0_8_ = dVar15;
            auVar21 = divpd(auVar20,auVar21);
            dVar17 = simulation->alpha;
            j = (int)lVar14 + 1;
            dVar16 = delUVbyDelZ(U,V,(int)lVar13,j,2,dVar17,grid->dely);
            dVar17 = delXSqrdByDelZ(U,(int)lVar13 + 1,j,1,dVar17,grid->delx);
            local_78 = auVar21._0_8_;
            dStack_70 = auVar21._8_8_;
            dVar19 = ((((dStack_70 + local_78) / simulation->Re - dVar17) - dVar16) + simulation->GX
                     ) * delt + dVar19;
LAB_001042eb:
            ppdVar10[lVar13][lVar14 + 1] = dVar19;
          }
          else {
            if ((bVar1 & 2) != 0) {
              dVar19 = U[lVar13 + 1][lVar14 + 1];
              goto LAB_001042eb;
            }
            if ((bVar1 & 8) != 0) {
              dVar19 = U[lVar13][lVar14 + 1];
              ppdVar10 = F + -1;
              goto LAB_001042eb;
            }
          }
          lVar14 = lVar14 + 1;
        } while ((ulong)(iVar3 + 1) - 1 != lVar14);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != lVar9);
    if (uVar2 != 0) {
      iVar3 = grid->delj;
      lVar13 = 1;
      do {
        if (-1 < iVar3) {
          pcVar5 = FLAG[lVar13];
          uVar12 = 0;
          do {
            bVar1 = pcVar5[uVar12];
            if (bVar1 == 0xf) {
              pdVar6 = V[lVar13];
              dVar19 = pdVar6[uVar12 + 1];
              auVar22._0_8_ =
                   V[lVar13 + -1][uVar12 + 1] + (V[lVar13 + 1][uVar12 + 1] - (dVar19 + dVar19));
              auVar22._8_8_ = pdVar6[uVar12] + (pdVar6[uVar12 + 2] - (dVar19 + dVar19));
              auVar8._8_8_ = dVar18;
              auVar8._0_8_ = dVar15;
              auVar21 = divpd(auVar22,auVar8);
              dVar17 = simulation->alpha;
              dVar16 = delUVbyDelZ(U,V,(int)lVar13,(int)uVar12,1,dVar17,grid->delx);
              dVar17 = delXSqrdByDelZ(V,(int)lVar13,(int)uVar12 + 1,2,dVar17,grid->dely);
              local_78 = auVar21._0_8_;
              dStack_70 = auVar21._8_8_;
              G[lVar13][uVar12] =
                   ((((dStack_70 + local_78) / simulation->Re - dVar17) - dVar16) + simulation->GY)
                   * delt + dVar19;
            }
            else if ((bVar1 & 1) == 0) {
              if ((bVar1 & 4) != 0) {
                G[lVar13][uVar12 - 1] = V[lVar13 + -1][uVar12];
              }
            }
            else {
              G[lVar13][uVar12] = V[lVar13][uVar12 + 1];
            }
            uVar12 = uVar12 + 1;
          } while (iVar3 + 1 != uVar12);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar9);
    }
  }
  bVar1 = grid->edges;
  if (((bVar1 & 4) != 0) && (uVar4 = grid->delj, -1 < (int)uVar4)) {
    pdVar6 = U[1];
    pdVar7 = *F;
    lVar9 = 0;
    do {
      pdVar7[lVar9] = pdVar6[lVar9];
      lVar9 = lVar9 + 1;
    } while ((ulong)uVar4 + 1 != lVar9);
  }
  if (((bVar1 & 8) != 0) && (uVar4 = grid->delj, -1 < (int)uVar4)) {
    pdVar6 = U[lVar11 + 1];
    pdVar7 = F[lVar11];
    lVar11 = 0;
    do {
      pdVar7[lVar11] = pdVar6[lVar11];
      lVar11 = lVar11 + 1;
    } while ((ulong)uVar4 + 1 != lVar11);
  }
  if ((bVar1 & 2) != 0 && -1 < (int)uVar2) {
    lVar11 = 0;
    do {
      *G[lVar11] = V[lVar11][1];
      lVar11 = lVar11 + 1;
    } while ((ulong)uVar2 + 1 != lVar11);
  }
  if ((bVar1 & 1) != 0 && -1 < (int)uVar2) {
    iVar3 = grid->delj;
    uVar12 = 0;
    do {
      G[uVar12][iVar3] = V[uVar12][(long)iVar3 + 1];
      uVar12 = uVar12 + 1;
    } while (uVar2 + 1 != uVar12);
  }
  return;
}

Assistant:

void    compFG (REAL **U, REAL **V, REAL **F, REAL **G, char **FLAG, REAL delt,
		lattice *grid, fluidSim *simulation)
{
	/* Compute the auxiliary arrays F and G */
	REAL d2ux, d2uy, d2vx, d2vy;
	REAL du2x, dv2y;
	REAL duvx, duvy;
	REAL dxSqrd = sqr(grid->delx);
	REAL dySqrd = sqr(grid->dely);
	short flag;
	int i,j;
	for (i = 0; i <= grid->deli; i++)
	{
		for (j = 1; j <= grid->delj; j++)
		{
			flag = FLAG[i][j];
			if (flag == C_F) /* Pure fluid cells */
			{
				/* !! Notice: The index of F is shifted to match that of U! This computes the boundary condition of U!
				 * Therefore there is no shift in i-direction here!! */
				d2ux = (U[i+2][j] - 2*U[i+1][j] + U[i][j])/dxSqrd;
				d2uy = (U[i+1][j+1] - 2*U[i+1][j] + U[i+1][j-1])/dySqrd;

				duvy = delUVbyDelZ(U,V,i,j,DERIVE_BY_Y,simulation->alpha,grid->dely);
				du2x = delXSqrdByDelZ(U,i+1,j,DERIVE_BY_X,simulation->alpha,grid->delx);

				F[i][j] = U[i+1][j] + delt*((d2ux+d2uy)/simulation->Re - du2x - duvy + simulation->GX);
			}
			else if (flag & B_O)       /* East */
				F[i][j] = U[i+1][j];
			else if (flag & B_W)  /* West */
				F[i-1][j] = U[i][j];
		}
	}
	for (i = 1; i <= grid->deli; i++)
	{
		for (j = 0; j <= grid->delj; j++)
		{
			flag = FLAG[i][j];
			if (flag == C_F) /* Pure fluid cells */
			{
				/* A similar shift holds for G, except in the j-direction! */
				d2vx = (V[i+1][j+1] - 2*V[i][j+1] + V[i-1][j+1])/dxSqrd;
				d2vy = (V[i][j+2] - 2*V[i][j+1] + V[i][j])/dySqrd;

				duvx = delUVbyDelZ(U,V,i,j,DERIVE_BY_X,simulation->alpha,grid->delx);
				dv2y = delXSqrdByDelZ(V,i,j+1,DERIVE_BY_Y,simulation->alpha,grid->dely);

				G[i][j] = V[i][j+1] + delt*((d2vx+d2vy)/simulation->Re - dv2y - duvx + simulation->GY);
			}
			else if (flag & B_N)       /* North */
				G[i][j] = V[i][j+1];
			else if (flag & B_S)  /* South */
				G[i][j-1] = V[i-1][j];
		}
	}
	if (grid->edges & LEFT)
	{
		for (j = 0; j < grid->delj+1; j++)
			F[0][j] = U[1][j];
	}
	if (grid->edges & RIGHT)
	{
		for (j = 0; j < grid->delj+1; j++)
			F[grid->deli][j] = U[grid->deli+1][j];
	}
	if (grid->edges & BOTTOM)
	{
		for (i = 0; i < grid->deli+1; i++)
			G[i][0] = V[i][1];
	}
	if (grid->edges & TOP)
	{
		for (i = 0; i < grid->deli+1; i++)
			G[i][grid->delj] = V[i][grid->delj+1];
	}
	return;
}